

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

int * Gia_ManDeriveNexts(Gia_Man_t *p)

{
  Gia_Rpr_t *pGVar1;
  int *piVar2;
  void *__ptr;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  pGVar1 = p->pReprs;
  if (pGVar1 == (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x108,"int *Gia_ManDeriveNexts(Gia_Man_t *)");
  }
  if (p->pNexts == (int *)0x0) {
    uVar5 = p->nObjs;
    piVar2 = (int *)calloc((long)(int)uVar5,4);
    __ptr = malloc((long)(int)uVar5 << 2);
    uVar4 = 0;
    uVar3 = 0;
    if (0 < (int)uVar5) {
      uVar3 = (ulong)uVar5;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      *(int *)((long)__ptr + uVar4 * 4) = (int)uVar4;
    }
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      uVar5 = (uint)pGVar1[uVar4] & 0xfffffff;
      if ((uVar5 != 0) && (uVar5 != 0xfffffff)) {
        piVar2[*(uint *)((long)__ptr + (ulong)uVar5 * 4)] = (int)uVar4;
        *(int *)((long)__ptr + (ulong)uVar5 * 4) = (int)uVar4;
      }
    }
    free(__ptr);
    return piVar2;
  }
  __assert_fail("p->pNexts == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                ,0x109,"int *Gia_ManDeriveNexts(Gia_Man_t *)");
}

Assistant:

int * Gia_ManDeriveNexts( Gia_Man_t * p )
{
    unsigned * pNexts, * pTails;
    int i;
    assert( p->pReprs != NULL );
    assert( p->pNexts == NULL );
    pNexts = ABC_CALLOC( unsigned, Gia_ManObjNum(p) );
    pTails = ABC_ALLOC( unsigned, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        pTails[i] = i;
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
    {
        if ( !p->pReprs[i].iRepr || p->pReprs[i].iRepr == GIA_VOID )
            continue;
        pNexts[ pTails[p->pReprs[i].iRepr] ] = i;
        pTails[p->pReprs[i].iRepr] = i;
    }
    ABC_FREE( pTails );
    return (int *)pNexts;
}